

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineColorBlendStateCreateInfo *state)

{
  void *pvVar1;
  undefined8 uVar2;
  VkPipelineColorBlendStateCreateFlags VVar3;
  VkBool32 VVar4;
  VkLogicOp VVar5;
  deUint32 dVar6;
  VkStructureType VVar7;
  undefined4 uVar8;
  allocator_type local_31;
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  local_30 [24];
  
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            (local_30,state->pAttachments,state->pAttachments + state->attachmentCount,&local_31);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::_M_move_assign(&this->m_colorBlendStateAttachments,local_30);
  std::
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~_Vector_base((_Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                   *)local_30);
  VVar7 = state->sType;
  uVar8 = *(undefined4 *)&state->field_0x4;
  pvVar1 = state->pNext;
  VVar3 = state->flags;
  VVar4 = state->logicOpEnable;
  VVar5 = state->logicOp;
  dVar6 = state->attachmentCount;
  uVar2 = *(undefined8 *)state->blendConstants;
  (this->m_colorBlendState).pAttachments = state->pAttachments;
  *(undefined8 *)(this->m_colorBlendState).blendConstants = uVar2;
  *(undefined8 *)((this->m_colorBlendState).blendConstants + 2) =
       *(undefined8 *)(state->blendConstants + 2);
  (this->m_colorBlendState).flags = VVar3;
  (this->m_colorBlendState).logicOpEnable = VVar4;
  (this->m_colorBlendState).logicOp = VVar5;
  (this->m_colorBlendState).attachmentCount = dVar6;
  (this->m_colorBlendState).sType = VVar7;
  *(undefined4 *)&(this->m_colorBlendState).field_0x4 = uVar8;
  (this->m_colorBlendState).pNext = pvVar1;
  (this->m_colorBlendState).pAttachments =
       (this->m_colorBlendStateAttachments).
       super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkGraphicsPipelineCreateInfo).pColorBlendState = &this->m_colorBlendState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineColorBlendStateCreateInfo& state)
{
	m_colorBlendStateAttachments	= std::vector<vk::VkPipelineColorBlendAttachmentState>(state.pAttachments, state.pAttachments + state.attachmentCount);
	m_colorBlendState				= state;
	m_colorBlendState.pAttachments	= &m_colorBlendStateAttachments[0];
	pColorBlendState				= &m_colorBlendState;

	return *this;
}